

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O1

void __thiscall
lddgraph::ldd(lddgraph *this,string *file,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *libraries)

{
  size_t __n;
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  istream *piVar4;
  long lVar5;
  string lddline;
  string cmdresult;
  istringstream cmdstream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  char *local_240;
  long local_238;
  char local_230;
  undefined7 uStack_22f;
  string *local_220;
  long *local_218;
  undefined8 uStack_210;
  long local_208 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  ios_base local_138 [264];
  
  local_240 = &local_230;
  local_238 = 0;
  local_230 = '\0';
  local_220 = file;
  local_1f8 = libraries;
  if (this->_useldd == true) {
    std::operator+(&local_268,"ldd ",file);
    local_1a8 = 0;
    local_1a0 = 0;
    local_1b0 = &local_1a0;
    pFVar2 = popen(local_268._M_dataplus._M_p,"r");
    local_208[0] = 0;
    local_218 = (long *)0x0;
    uStack_210 = 0;
    while( true ) {
      pcVar3 = fgets((char *)&local_218,0x18,pFVar2);
      if (pcVar3 == (char *)0x0) break;
      std::__cxx11::string::append((char *)&local_1b0);
    }
    pclose(pFVar2);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_1b0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    setenv("LD_TRACE_LOADED_OBJECTS","1",1);
    local_1a8 = 0;
    local_1a0 = 0;
    local_1b0 = &local_1a0;
    pFVar2 = popen((file->_M_dataplus)._M_p,"r");
    local_268.field_2._M_allocated_capacity = 0;
    local_268._M_dataplus._M_p = (char *)0x0;
    local_268._M_string_length = 0;
    while( true ) {
      pcVar3 = fgets((char *)&local_268,0x18,pFVar2);
      if (pcVar3 == (char *)0x0) break;
      std::__cxx11::string::append((char *)&local_1b0);
    }
    pclose(pFVar2);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_1b0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    unsetenv("LD_TRACE_LOADED_OBJECTS");
  }
  if (this->_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_240,local_238);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_240,_S_in)
  ;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00105dbb:
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_1b0,(string *)&local_268,'\n');
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      return;
    }
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"=>","");
    lVar5 = std::__cxx11::string::find((char *)local_1d0,(ulong)local_1f0[0],0);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
    if (lVar5 != -1) {
      std::__cxx11::string::find((char)&local_268,0x3e);
      std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_268);
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_218);
      if (local_218 != local_208) {
        operator_delete(local_218,local_208[0] + 1);
      }
    }
    std::__cxx11::string::find((char)&local_268,0x28);
    std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_268);
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_218);
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    trim(&local_268);
  } while (local_268._M_string_length == 0);
  __n = local_220->_M_string_length;
  if (__n == local_268._M_string_length) goto code_r0x00105f28;
  goto LAB_00105f4a;
code_r0x00105f28:
  if (__n != 0) {
    iVar1 = bcmp((local_220->_M_dataplus)._M_p,local_268._M_dataplus._M_p,__n);
    if (iVar1 != 0) {
LAB_00105f4a:
      trim(&local_268);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1f8,&local_268);
    }
  }
  goto LAB_00105dbb;
}

Assistant:

void ldd(const string & file, vector<string> & libraries)
    {
      string cmdresult;
      if (_useldd)
      {
        cmdresult = system("ldd " + file);
      }
      else
      {
        setenv("LD_TRACE_LOADED_OBJECTS", "1", 1);
        cmdresult = system(file);
        unsetenv("LD_TRACE_LOADED_OBJECTS");
      }
      if (_verbose)
        cout << cmdresult;
      istringstream cmdstream(cmdresult);
      string lddline;
      while (std::getline(cmdstream, lddline, '\n'))
      {
        if (contains(lddline, "=>"))
          lddline = lddline.substr(lddline.find_first_of('>') + 1);
        lddline = lddline.substr(0, lddline.find_first_of('('));
        trim(lddline);
        if (lddline.size() > 0 && file != lddline)
          libraries.push_back(trim(lddline));
      }
    }